

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::SerializationException::
SerializationException<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
          (SerializationException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          LogicalType *params_2,LogicalType *params_3)

{
  LogicalType *in_stack_ffffffffffffff48;
  undefined1 local_a0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_68,(string *)params);
  ::std::__cxx11::string::string((string *)(local_a0 + 0x18),(string *)params_1);
  LogicalType::LogicalType((LogicalType *)local_a0,params_2);
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff48,params_3);
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
            (&local_48,(Exception *)msg,&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a0 + 0x18),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
             (LogicalType *)&stack0xffffffffffffff48,in_stack_ffffffffffffff48);
  SerializationException(this,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffff48);
  LogicalType::~LogicalType((LogicalType *)local_a0);
  ::std::__cxx11::string::~string((string *)(local_a0 + 0x18));
  ::std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

explicit SerializationException(const string &msg, ARGS... params)
	    : SerializationException(ConstructMessage(msg, params...)) {
	}